

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_pu.cpp
# Opt level: O1

void __thiscall PU_ConversionsJustPu_Test::TestBody(PU_ConversionsJustPu_Test *this)

{
  double unaff_RBX;
  pointer *__ptr;
  char *pcVar1;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var2;
  double unaff_retaddr;
  char *in_stack_00000008;
  AssertionResult gtest_ar;
  AssertHelper local_20;
  internal local_18 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffff0;
  
  _Var2._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       units::convert<units::unit,units::unit>(1.0,(unit *)&units::pu,(unit *)&units::ohm,5.0);
  local_20.data_ = (AssertHelperData *)0x4014000000000000;
  testing::internal::CmpHelperEQ<double,double>
            (local_18,"convert(1.0, pu, ohm, 5.0)","5.0",(double *)&stack0xffffffffffffffd8,
             (double *)&local_20);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd8);
    if (in_stack_fffffffffffffff0 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_fffffffffffffff0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_pu.cpp",
               0x4c,pcVar1);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&stack0xffffffffffffffd8);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if (_Var2._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)_Var2._M_head_impl + 8))();
    }
  }
  if (in_stack_fffffffffffffff0 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffffff0,in_stack_fffffffffffffff0);
  }
  units::convert<units::unit,units::unit>
            (136.0,(unit *)&units::kV,(unit *)&units::pu,500.0,138000.0);
  testing::internal::DoubleNearPredFormat
            ((char *)_Var2._M_head_impl,(char *)0x10b9c9,in_stack_00000008,unaff_retaddr,unaff_RBX,
             (double)in_stack_fffffffffffffff0);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd8);
    if (in_stack_fffffffffffffff0 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_fffffffffffffff0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_pu.cpp",
               0x4e,pcVar1);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&stack0xffffffffffffffd8);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if ((__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )_Var2._M_head_impl !=
        (__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)_Var2._M_head_impl + 8))();
    }
  }
  if (in_stack_fffffffffffffff0 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffffff0,in_stack_fffffffffffffff0);
  }
  _Var2._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       units::convert<units::unit,units::unit>(2.7,(unit *)&units::pu,(unit *)&units::puMW);
  local_20.data_ = (AssertHelperData *)0x400599999999999a;
  testing::internal::CmpHelperEQ<double,double>
            (local_18,"convert(2.7, pu, puMW)","2.7",(double *)&stack0xffffffffffffffd8,
             (double *)&local_20);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd8);
    if (in_stack_fffffffffffffff0 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_fffffffffffffff0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_pu.cpp",
               0x4f,pcVar1);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&stack0xffffffffffffffd8);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if (_Var2._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)_Var2._M_head_impl + 8))();
    }
  }
  if (in_stack_fffffffffffffff0 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffffff0,in_stack_fffffffffffffff0);
  }
  units::convert<units::unit,units::unit>(3.0,(unit *)&units::pu,(unit *)&units::MW,100.0,25000.0);
  testing::internal::DoubleNearPredFormat
            ((char *)_Var2._M_head_impl,(char *)0x10bb65,in_stack_00000008,unaff_retaddr,unaff_RBX,
             (double)in_stack_fffffffffffffff0);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd8);
    if (in_stack_fffffffffffffff0 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_fffffffffffffff0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_pu.cpp",
               0x51,pcVar1);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&stack0xffffffffffffffd8);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if ((__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )_Var2._M_head_impl !=
        (__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)_Var2._M_head_impl + 8))();
    }
  }
  if (in_stack_fffffffffffffff0 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffffff0,in_stack_fffffffffffffff0);
  }
  return;
}

Assistant:

TEST(PU, ConversionsJustPu)
{
    EXPECT_EQ(convert(1.0, pu, ohm, 5.0), 5.0);
    EXPECT_NEAR(
        convert(136.0, kV, pu, 500, 138000), 0.9855, test::tolerance * 100);
    EXPECT_EQ(convert(2.7, pu, puMW), 2.7);

    EXPECT_NEAR(convert(3.0, pu, MW, 100, 25000), 300, test::tolerance * 300);
}